

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dieharder_file.cc
# Opt level: O2

bool try_parse<unsigned_long>(char *str,unsigned_long *res)

{
  uint uVar1;
  stringstream stream;
  ulong local_198 [2];
  ostream local_188 [16];
  uint auStack_178 [90];
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_198);
  std::operator<<(local_188,str);
  *res = 0;
  std::istream::_M_extract<unsigned_long>(local_198);
  uVar1 = *(uint *)((long)auStack_178 + *(long *)(local_198[0] - 0x18));
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  return (uVar1 & 7) == 2;
}

Assistant:

bool try_parse(const char *const str, T &res) {
  std::stringstream stream;
  stream << str;
  res = T{};
  stream >> res;
  return stream.eof() and not stream.fail();
}